

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_crypto_three_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t srcidx;
  uint32_t srcidx_00;
  uint32_t destidx;
  TCGv_ptr arg;
  TCGv_ptr arg_00;
  TCGv_ptr arg_01;
  TCGv_i64 arg_02;
  int local_7c;
  TCGv_i64 pTStack_78;
  int pass;
  TCGv_i64 tcg_res [2];
  TCGv_i64 tcg_op2;
  TCGv_i64 tcg_op1;
  TCGv_ptr tcg_rm_ptr;
  TCGv_ptr tcg_rn_ptr;
  TCGv_ptr tcg_rd_ptr;
  CryptoThreeOpFn *genfn;
  _Bool feature;
  int rd;
  int rn;
  int rm;
  int o;
  int opcode;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,10,2);
  uVar3 = extract32(insn,0xe,1);
  srcidx = extract32(insn,0x10,5);
  srcidx_00 = extract32(insn,5,5);
  destidx = extract32(insn,0,5);
  if (uVar3 == 0) {
    switch(uVar2) {
    case 0:
      genfn._3_1_ = isar_feature_aa64_sha512(s->isar);
      tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sha512h;
      break;
    case 1:
      genfn._3_1_ = isar_feature_aa64_sha512(s->isar);
      tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sha512h2;
      break;
    case 2:
      genfn._3_1_ = isar_feature_aa64_sha512(s->isar);
      tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sha512su1;
      break;
    case 3:
      genfn._3_1_ = isar_feature_aa64_sha3(s->isar);
      tcg_rd_ptr = (TCGv_ptr)0x0;
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x36e4,(char *)0x0);
    }
  }
  else if (uVar2 == 0) {
    genfn._3_1_ = isar_feature_aa64_sm3(s->isar);
    tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sm3partw1;
  }
  else if (uVar2 == 1) {
    genfn._3_1_ = isar_feature_aa64_sm3(s->isar);
    tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sm3partw2;
  }
  else {
    if (uVar2 != 2) {
      unallocated_encoding_aarch64(s);
      return;
    }
    genfn._3_1_ = isar_feature_aa64_sm4(s->isar);
    tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sm4ekey;
  }
  if (genfn._3_1_ == false) {
    unallocated_encoding_aarch64(s);
  }
  else {
    _Var1 = fp_access_check(s);
    if (_Var1) {
      if (tcg_rd_ptr == (TCGv_ptr)0x0) {
        arg_02 = tcg_temp_new_i64(tcg_ctx_00);
        tcg_res[1] = tcg_temp_new_i64(tcg_ctx_00);
        pTStack_78 = tcg_temp_new_i64(tcg_ctx_00);
        tcg_res[0] = tcg_temp_new_i64(tcg_ctx_00);
        for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
          read_vec_element(s,arg_02,srcidx_00,local_7c,MO_64);
          read_vec_element(s,tcg_res[1],srcidx,local_7c,MO_64);
          tcg_gen_rotli_i64_aarch64
                    (tcg_ctx_00,*(TCGv_i64 *)((long)&stack0xffffffffffffff88 + (long)local_7c * 8),
                     tcg_res[1],1);
          tcg_gen_xor_i64_aarch64
                    (tcg_ctx_00,*(TCGv_i64 *)((long)&stack0xffffffffffffff88 + (long)local_7c * 8),
                     *(TCGv_i64 *)((long)&stack0xffffffffffffff88 + (long)local_7c * 8),arg_02);
        }
        write_vec_element(s,pTStack_78,destidx,0,MO_64);
        write_vec_element(s,tcg_res[0],destidx,1,MO_64);
        tcg_temp_free_i64(tcg_ctx_00,arg_02);
        tcg_temp_free_i64(tcg_ctx_00,tcg_res[1]);
        tcg_temp_free_i64(tcg_ctx_00,pTStack_78);
        tcg_temp_free_i64(tcg_ctx_00,tcg_res[0]);
      }
      else {
        arg = vec_full_reg_ptr(s,destidx);
        arg_00 = vec_full_reg_ptr(s,srcidx_00);
        arg_01 = vec_full_reg_ptr(s,srcidx);
        (*(code *)tcg_rd_ptr)(tcg_ctx_00,arg,arg_00,arg_01);
        tcg_temp_free_ptr(tcg_ctx_00,arg);
        tcg_temp_free_ptr(tcg_ctx_00,arg_00);
        tcg_temp_free_ptr(tcg_ctx_00,arg_01);
      }
    }
  }
  return;
}

Assistant:

static void disas_crypto_three_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int o =  extract32(insn, 14, 1);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool feature;
    CryptoThreeOpFn *genfn;

    if (o == 0) {
        switch (opcode) {
        case 0: /* SHA512H */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h;
            break;
        case 1: /* SHA512H2 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h2;
            break;
        case 2: /* SHA512SU1 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512su1;
            break;
        case 3: /* RAX1 */
            feature = dc_isar_feature(aa64_sha3, s);
            genfn = NULL;
            break;
        default:
            g_assert_not_reached();
        }
    } else {
        switch (opcode) {
        case 0: /* SM3PARTW1 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw1;
            break;
        case 1: /* SM3PARTW2 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw2;
            break;
        case 2: /* SM4EKEY */
            feature = dc_isar_feature(aa64_sm4, s);
            genfn = gen_helper_crypto_sm4ekey;
            break;
        default:
            unallocated_encoding(s);
            return;
        }
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (genfn) {
        TCGv_ptr tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr;

        tcg_rd_ptr = vec_full_reg_ptr(s, rd);
        tcg_rn_ptr = vec_full_reg_ptr(s, rn);
        tcg_rm_ptr = vec_full_reg_ptr(s, rm);

        genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr);

        tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rm_ptr);
    } else {
        TCGv_i64 tcg_op1, tcg_op2, tcg_res[2];
        int pass;

        tcg_op1 = tcg_temp_new_i64(tcg_ctx);
        tcg_op2 = tcg_temp_new_i64(tcg_ctx);
        tcg_res[0] = tcg_temp_new_i64(tcg_ctx);
        tcg_res[1] = tcg_temp_new_i64(tcg_ctx);

        for (pass = 0; pass < 2; pass++) {
            read_vec_element(s, tcg_op1, rn, pass, MO_64);
            read_vec_element(s, tcg_op2, rm, pass, MO_64);

            tcg_gen_rotli_i64(tcg_ctx, tcg_res[pass], tcg_op2, 1);
            tcg_gen_xor_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_op1);
        }
        write_vec_element(s, tcg_res[0], rd, 0, MO_64);
        write_vec_element(s, tcg_res[1], rd, 1, MO_64);

        tcg_temp_free_i64(tcg_ctx, tcg_op1);
        tcg_temp_free_i64(tcg_ctx, tcg_op2);
        tcg_temp_free_i64(tcg_ctx, tcg_res[0]);
        tcg_temp_free_i64(tcg_ctx, tcg_res[1]);
    }
}